

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * google::protobuf::internal::
       WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                 (UnknownFieldLiteParserHelper *field_parser,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint32_t tag;
  char *local_30;
  uint local_24;
  
  local_30 = ptr;
  while( true ) {
    bVar1 = ParseContext::Done(ctx,&local_30);
    if (bVar1) {
      return local_30;
    }
    local_30 = ReadTag(local_30,&local_24,0);
    if (local_30 == (char *)0x0) break;
    if (((ulong)local_24 == 0) || ((local_24 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_24 - 1;
      return local_30;
    }
    local_30 = FieldParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                         ((ulong)local_24,field_parser,local_30,ctx);
    if (local_30 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_NODISCARD const char* WireFormatParser(T& field_parser,
                                                const char* ptr,
                                                ParseContext* ctx) {
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
    if (tag == 0 || (tag & 7) == 4) {
      ctx->SetLastTag(tag);
      return ptr;
    }
    ptr = FieldParser(tag, field_parser, ptr, ctx);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
  }
  return ptr;
}